

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O1

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterSucceeds_Test::
~TEST_MockComparatorCopierTest_customTypeOutputParameterSucceeds_Test
          (TEST_MockComparatorCopierTest_customTypeOutputParameterSucceeds_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterSucceeds)
{
    MyTypeForTesting expectedObject(55);
    MyTypeForTesting actualObject(99);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    mock().expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &expectedObject);
    mock().actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &actualObject);

    mock().checkExpectations();
    CHECK_EQUAL(55, *(expectedObject.value));
    CHECK_EQUAL(55, *(actualObject.value));

    mock().removeAllComparatorsAndCopiers();
}